

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O0

void Assimp::ByteSwap::Swap2(void *_szOut)

{
  uint8_t *szOut;
  void *_szOut_local;
  
  if (_szOut != (void *)0x0) {
    std::swap<unsigned_char>((uchar *)_szOut,(uchar *)((long)_szOut + 1));
    return;
  }
  __assert_fail("_szOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/ByteSwapper.h"
                ,0x49,"static void Assimp::ByteSwap::Swap2(void *)");
}

Assistant:

static inline void Swap2(void* _szOut)
    {
        ai_assert(_szOut);

#if _MSC_VER >= 1400
        uint16_t* const szOut = reinterpret_cast<uint16_t*>(_szOut);
        *szOut = _byteswap_ushort(*szOut);
#else
        uint8_t* const szOut = reinterpret_cast<uint8_t*>(_szOut);
        std::swap(szOut[0],szOut[1]);
#endif
    }